

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

char * GetParseTreeNodeName(SynBase *syntax)

{
  SynBase *syntax_local;
  
  switch(syntax->typeID) {
  case 0:
    syntax_local = (SynBase *)anon_var_dwarf_1110fa;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0xe84,"const char *GetParseTreeNodeName(SynBase *)");
  case 3:
    syntax_local = (SynBase *)anon_var_dwarf_111106;
    break;
  case 4:
    syntax_local = (SynBase *)anon_var_dwarf_11111e;
    break;
  case 5:
    syntax_local = (SynBase *)anon_var_dwarf_111136;
    break;
  case 6:
    syntax_local = (SynBase *)anon_var_dwarf_111142;
    break;
  case 7:
    syntax_local = (SynBase *)anon_var_dwarf_11114e;
    break;
  case 8:
    syntax_local = (SynBase *)anon_var_dwarf_11115a;
    break;
  case 9:
    syntax_local = (SynBase *)anon_var_dwarf_111166;
    break;
  case 10:
    syntax_local = (SynBase *)anon_var_dwarf_111172;
    break;
  case 0xb:
    syntax_local = (SynBase *)anon_var_dwarf_11117e;
    break;
  case 0xc:
    syntax_local = (SynBase *)anon_var_dwarf_111196;
    break;
  case 0xd:
    syntax_local = (SynBase *)anon_var_dwarf_1111a2;
    break;
  case 0xe:
    syntax_local = (SynBase *)anon_var_dwarf_1111ba;
    break;
  case 0xf:
    syntax_local = (SynBase *)anon_var_dwarf_1111d2;
    break;
  case 0x10:
    syntax_local = (SynBase *)anon_var_dwarf_1111de;
    break;
  case 0x11:
    syntax_local = (SynBase *)anon_var_dwarf_1111ea;
    break;
  case 0x12:
    syntax_local = (SynBase *)anon_var_dwarf_1111f6;
    break;
  case 0x13:
    syntax_local = (SynBase *)anon_var_dwarf_111202;
    break;
  case 0x14:
    syntax_local = (SynBase *)anon_var_dwarf_11120e;
    break;
  case 0x15:
    syntax_local = (SynBase *)anon_var_dwarf_11121a;
    break;
  case 0x16:
    syntax_local = (SynBase *)anon_var_dwarf_111226;
    break;
  case 0x17:
    syntax_local = (SynBase *)anon_var_dwarf_111232;
    break;
  case 0x18:
    syntax_local = (SynBase *)anon_var_dwarf_11123e;
    break;
  case 0x19:
    syntax_local = (SynBase *)anon_var_dwarf_11124a;
    break;
  case 0x1a:
    syntax_local = (SynBase *)anon_var_dwarf_111256;
    break;
  case 0x1b:
    syntax_local = (SynBase *)anon_var_dwarf_111262;
    break;
  case 0x1c:
    syntax_local = (SynBase *)anon_var_dwarf_11126e;
    break;
  case 0x1d:
    syntax_local = (SynBase *)anon_var_dwarf_11127a;
    break;
  case 0x1e:
    syntax_local = (SynBase *)anon_var_dwarf_111286;
    break;
  case 0x1f:
    syntax_local = (SynBase *)anon_var_dwarf_111292;
    break;
  case 0x20:
    syntax_local = (SynBase *)anon_var_dwarf_11129e;
    break;
  case 0x21:
    syntax_local = (SynBase *)anon_var_dwarf_1112aa;
    break;
  case 0x22:
    syntax_local = (SynBase *)anon_var_dwarf_1112b6;
    break;
  case 0x23:
    syntax_local = (SynBase *)anon_var_dwarf_1112c2;
    break;
  case 0x24:
    syntax_local = (SynBase *)anon_var_dwarf_1112ce;
    break;
  case 0x25:
    syntax_local = (SynBase *)anon_var_dwarf_1112da;
    break;
  case 0x26:
    syntax_local = (SynBase *)anon_var_dwarf_1112e6;
    break;
  case 0x27:
    syntax_local = (SynBase *)anon_var_dwarf_1112f2;
    break;
  case 0x28:
    syntax_local = (SynBase *)anon_var_dwarf_1112fe;
    break;
  case 0x29:
    syntax_local = (SynBase *)anon_var_dwarf_11130a;
    break;
  case 0x2a:
    syntax_local = (SynBase *)anon_var_dwarf_111322;
    break;
  case 0x2b:
    syntax_local = (SynBase *)anon_var_dwarf_11132e;
    break;
  case 0x2c:
    syntax_local = (SynBase *)anon_var_dwarf_11133a;
    break;
  case 0x2d:
    syntax_local = (SynBase *)anon_var_dwarf_111346;
    break;
  case 0x2e:
    syntax_local = (SynBase *)anon_var_dwarf_111352;
    break;
  case 0x2f:
    syntax_local = (SynBase *)anon_var_dwarf_11135e;
    break;
  case 0x30:
    syntax_local = (SynBase *)anon_var_dwarf_11136a;
    break;
  case 0x31:
    syntax_local = (SynBase *)anon_var_dwarf_111376;
    break;
  case 0x32:
    syntax_local = (SynBase *)anon_var_dwarf_111382;
    break;
  case 0x33:
    syntax_local = (SynBase *)anon_var_dwarf_11138e;
    break;
  case 0x34:
    syntax_local = (SynBase *)anon_var_dwarf_11139a;
    break;
  case 0x35:
    syntax_local = (SynBase *)anon_var_dwarf_1113a6;
    break;
  case 0x36:
    syntax_local = (SynBase *)anon_var_dwarf_1113b2;
    break;
  case 0x37:
    syntax_local = (SynBase *)anon_var_dwarf_1113be;
    break;
  case 0x38:
    syntax_local = (SynBase *)anon_var_dwarf_1113ca;
    break;
  case 0x39:
    syntax_local = (SynBase *)anon_var_dwarf_1113d6;
    break;
  case 0x3a:
    syntax_local = (SynBase *)anon_var_dwarf_1113e2;
    break;
  case 0x3b:
    syntax_local = (SynBase *)anon_var_dwarf_1113ee;
    break;
  case 0x3c:
    syntax_local = (SynBase *)anon_var_dwarf_1113fa;
    break;
  case 0x3d:
    syntax_local = (SynBase *)anon_var_dwarf_111406;
    break;
  case 0x3e:
    syntax_local = (SynBase *)anon_var_dwarf_111412;
    break;
  case 0x3f:
    syntax_local = (SynBase *)anon_var_dwarf_11141e;
    break;
  case 0x40:
    syntax_local = (SynBase *)anon_var_dwarf_11142a;
    break;
  case 0x41:
    syntax_local = (SynBase *)anon_var_dwarf_111436;
    break;
  case 0x42:
    syntax_local = (SynBase *)anon_var_dwarf_111442;
    break;
  case 0x43:
    syntax_local = (SynBase *)anon_var_dwarf_11144e;
  }
  return (char *)syntax_local;
}

Assistant:

const char* GetParseTreeNodeName(SynBase *syntax)
{
	switch(syntax->typeID)
	{
	case SynError::myTypeID:
		return "SynError";
	case SynNothing::myTypeID:
		return "SynNothing";
	case SynIdentifier::myTypeID:
		return "SynIdentifier";
	case SynTypeAuto::myTypeID:
		return "SynTypeAuto";
	case SynTypeGeneric::myTypeID:
		return "SynTypeGeneric";
	case SynTypeSimple::myTypeID:
		return "SynTypeSimple";
	case SynTypeAlias::myTypeID:
		return "SynTypeAlias";
	case SynTypeArray::myTypeID:
		return "SynTypeArray";
	case SynTypeReference::myTypeID:
		return "SynTypeReference";
	case SynTypeFunction::myTypeID:
		return "SynTypeFunction";
	case SynTypeGenericInstance::myTypeID:
		return "SynTypeGenericInstance";
	case SynTypeof::myTypeID:
		return "SynTypeof";
	case SynBool::myTypeID:
		return "SynBool";
	case SynNumber::myTypeID:
		return "SynNumber";
	case SynNullptr::myTypeID:
		return "SynNullptr";
	case SynCharacter::myTypeID:
		return "SynCharacter";
	case SynString::myTypeID:
		return "SynString";
	case SynArray::myTypeID:
		return "SynArray";
	case SynGenerator::myTypeID:
		return "SynGenerator";
	case SynAlign::myTypeID:
		return "SynAlign";
	case SynTypedef::myTypeID:
		return "SynTypedef";
	case SynMemberAccess::myTypeID:
		return "SynMemberAccess";
	case SynCallArgument::myTypeID:
		return "SynCallArgument";
	case SynArrayIndex::myTypeID:
		return "SynArrayIndex";
	case SynFunctionCall::myTypeID:
		return "SynFunctionCall";
	case SynPreModify::myTypeID:
		return "SynPreModify";
	case SynPostModify::myTypeID:
		return "SynPostModify";
	case SynGetAddress::myTypeID:
		return "SynGetAddress";
	case SynDereference::myTypeID:
		return "SynDereference";
	case SynSizeof::myTypeID:
		return "SynSizeof";
	case SynNew::myTypeID:
		return "SynNew";
	case SynConditional::myTypeID:
		return "SynConditional";
	case SynReturn::myTypeID:
		return "SynReturn";
	case SynYield::myTypeID:
		return "SynYield";
	case SynBreak::myTypeID:
		return "SynBreak";
	case SynContinue::myTypeID:
		return "SynContinue";
	case SynBlock::myTypeID:
		return "SynBlock";
	case SynIfElse::myTypeID:
		return "SynIfElse";
	case SynFor::myTypeID:
		return "SynFor";
	case SynForEachIterator::myTypeID:
		return "SynForEachIterator";
	case SynForEach::myTypeID:
		return "SynForEach";
	case SynWhile::myTypeID:
		return "SynWhile";
	case SynDoWhile::myTypeID:
		return "SynDoWhile";
	case SynSwitchCase::myTypeID:
		return "SynSwitchCase";
	case SynSwitch::myTypeID:
		return "SynSwitch";
	case SynUnaryOp::myTypeID:
		return "SynUnaryOp";
	case SynBinaryOp::myTypeID:
		return "SynBinaryOp";
	case SynAssignment::myTypeID:
		return "SynAssignment";
	case SynModifyAssignment::myTypeID:
		return "SynModifyAssignment";
	case SynVariableDefinition::myTypeID:
		return "SynVariableDefinition";
	case SynVariableDefinitions::myTypeID:
		return "SynVariableDefinitions";
	case SynAccessor::myTypeID:
		return "SynAccessor";
	case SynFunctionArgument::myTypeID:
		return "SynFunctionArgument";
	case SynFunctionDefinition::myTypeID:
		return "SynFunctionDefinition";
	case SynShortFunctionArgument::myTypeID:
		return "SynShortFunctionArgument";
	case SynShortFunctionDefinition::myTypeID:
		return "SynShortFunctionDefinition";
	case SynConstant::myTypeID:
		return "SynConstant";
	case SynConstantSet::myTypeID:
		return "SynConstantSet";
	case SynClassPrototype::myTypeID:
		return "SynClassPrototype";
	case SynClassStaticIf::myTypeID:
		return "SynClassStaticIf";
	case SynClassElements::myTypeID:
		return "SynClassElements";
	case SynClassDefinition::myTypeID:
		return "SynClassDefinition";
	case SynEnumDefinition::myTypeID:
		return "SynEnumDefinition";
	case SynNamespaceDefinition::myTypeID:
		return "SynNamespaceDefinition";
	case SynModuleImport::myTypeID:
		return "SynModuleImport";
	case SynModule::myTypeID:
		return "SynModule";
	default:
		break;
	}

	assert(!"unknown type");
	return "unknown";
}